

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_light_object::save(xr_light_object *this,xr_writer *w)

{
  undefined1 local_24 [4];
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,0xb411,&LIGHT_VERSION);
  xr_writer::open_chunk(w,0xb442);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,&this->m_color,0x10);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<unsigned_int>(w,0xb436,&this->m_use_in_d3d);
  xr_writer::w_chunk<unsigned_int>(w,0xb413,&this->m_flags);
  xr_writer::w_chunk<unsigned_int>(w,0xb441,&this->m_control);
  if ((this->m_animation)._M_string_length != 0) {
    xr_writer::w_chunk(w,0xb438,&this->m_animation);
  }
  if ((this->m_texture)._M_string_length != 0) {
    xr_writer::w_chunk(w,0xb439,&this->m_texture);
  }
  if ((this->m_flags & 0x10) != 0) {
    xr_writer::open_chunk(w,0xb440);
    (*w->_vptr_xr_writer[2])(w,local_24,1);
    (*w->_vptr_xr_writer[2])(w,&(this->m_shape).fixme,0x10);
    (*w->_vptr_xr_writer[2])(w,local_24,2);
    xr_writer::w_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
              (w,&this->m_vertices);
    xr_writer::close_chunk(w);
  }
  return;
}

Assistant:

void xr_light_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(LIGHT_CHUNK_VERSION, LIGHT_VERSION);

	w.open_chunk(LIGHT_CHUNK_PARAMS);
	w.w_u32(m_type);
	w.w<fcolor>(m_color);
	w.w_float(m_brightness);
	w.w_float(m_range);
	w.w_float(m_attenuation_constant);
	w.w_float(m_attenuation_linear);
	w.w_float(m_attenuation_quadratic);
	w.w_float(m_cone_angle);
	w.w_float(m_unknown);
	w.close_chunk();

	w.w_chunk<uint32_t>(LIGHT_CHUNK_USE_IN_D3D, m_use_in_d3d);
	w.w_chunk<uint32_t>(LIGHT_CHUNK_FLAGS, m_flags);
	w.w_chunk<uint32_t>(LIGHT_CHUNK_CONTROL, m_control);

	if (!m_animation.empty())
		w.w_chunk(LIGHT_CHUNK_ANIMATION, m_animation);
	if (!m_texture.empty())
		w.w_chunk(LIGHT_CHUNK_TEXTURE, m_texture);

	if (m_flags & LIGHT_FLAG_FUZZY) {
		w.open_chunk(LIGHT_CHUNK_FUZZY_DATA);
		w.w_u8(m_shape.type);
		w.w<fvector4>(m_shape.fixme);
		w.w_size_u16(m_vertices.size());
		w.w_seq(m_vertices);
		w.close_chunk();
	}
}